

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall mjs::object::put(object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  property_attribute pVar2;
  object *this_00;
  gc_heap *pgVar3;
  gc_vector<mjs::object::property> *this_01;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar4;
  wstring_view key;
  property *local_78;
  property *it_1;
  object *proto;
  undefined1 auStack_50 [4];
  gc_heap_ptr_untracked<mjs::object,_true> p;
  property *local_40;
  property *it;
  value *pvStack_20;
  property_attribute attr_local;
  value *val_local;
  string *name_local;
  object *this_local;
  
  it._4_4_ = attr;
  pvStack_20 = val;
  val_local = (value *)name;
  name_local = (string *)this;
  _auStack_50 = string::view(name);
  pVar4 = find(this,_auStack_50);
  local_40 = pVar4.first;
  if (local_40 == (property *)0x0) {
    proto._4_4_ = (this->prototype_).pos_;
    while (bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                             ((gc_heap_ptr_untracked *)((long)&proto + 4)), bVar1) {
      pgVar3 = heap(this);
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference
                          ((gc_heap_ptr_untracked<mjs::object,_true> *)((long)&proto + 4),pgVar3);
      key = string::view((string *)val_local);
      pVar4 = find(this_00,key);
      local_78 = pVar4.first;
      if (local_78 != (property *)0x0) {
        pVar2 = property::attributes(local_78);
        bVar1 = has_attributes(pVar2,accessor);
        if (bVar1) {
          property::put(local_78,this,pvStack_20);
          return;
        }
        break;
      }
      proto._4_4_ = (this_00->prototype_).pos_;
    }
    if ((this->extensible_ & 1U) != 0) {
      pgVar3 = heap(this);
      this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                          (&this->properties_,pgVar3);
      gc_vector<mjs::object::property>::
      emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
                (this_01,(string *)val_local,pvStack_20,(property_attribute *)((long)&it + 4));
    }
  }
  else {
    pVar2 = property::attributes(local_40);
    bVar1 = has_attributes(pVar2,read_only);
    if (!bVar1) {
      property::put(local_40,this,pvStack_20);
    }
  }
  return;
}

Assistant:

void object::put(const string& name, const value& val, property_attribute attr) {
    //ES5.1, 8.12.5

    // See if there is already a property with this name
    if (auto it = find(name.view()).first; it) {
        if (has_attributes(it->attributes(), property_attribute::read_only)) {
            return;
        }
        it->put(*this, val);
        return;
    }

    // Check if there is an accessor property in a prototype
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name.view()).first) {
            if (has_attributes(it->attributes(), property_attribute::accessor)) {
                it->put(*this, val);
                return;
            }
            // Handle as insertion
            break;
        }
        p = proto.prototype_;
    }

    // Normal insertion
    if (extensible_) {
        properties_.dereference(heap()).emplace_back(name, val, attr);
    }
}